

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O2

void Gs::Normalize<Gs::Vector<float,3ul>,float>
               (Vector<float,_3UL> *outVec,Vector<float,_3UL> *inVec)

{
  float local_28;
  undefined8 local_24;
  float local_1c;
  
  local_28 = LengthSq<Gs::Vector<float,3ul>,float>(inVec);
  if (((local_28 == 0.0) && (!NAN(local_28))) || ((local_28 == 1.0 && (!NAN(local_28))))) {
    outVec->z = inVec->z;
    local_24._0_4_ = inVec->x;
    local_24._4_4_ = inVec->y;
  }
  else {
    if (local_28 < 0.0) {
      local_28 = sqrtf(local_28);
    }
    else {
      local_28 = SQRT(local_28);
    }
    local_28 = 1.0 / local_28;
    operator*((Gs *)&local_24,inVec,&local_28);
    outVec->z = local_1c;
  }
  outVec->x = (float)(int)local_24;
  outVec->y = (float)(int)((ulong)local_24 >> 0x20);
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}